

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestCase *pTVar1;
  TestInfo *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  pointer ppTVar5;
  FILE *__stream;
  pointer ppTVar6;
  bool bVar7;
  pointer ppTVar8;
  ulong uVar9;
  pointer ppTVar10;
  pointer pcVar11;
  ulong uVar12;
  stringstream stream;
  undefined1 local_220 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  ppTVar8 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar10 = (this->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar10 != ppTVar8) {
    uVar9 = 0;
    do {
      pTVar1 = ppTVar8[uVar9];
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar6 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar6 != ppTVar5) {
        bVar7 = false;
        uVar12 = 0;
        do {
          pTVar2 = ppTVar5[uVar12];
          if (pTVar2->matches_filter_ == true) {
            if (!bVar7) {
              printf("%s.",(pTVar1->name_)._M_dataplus._M_p);
              pbVar3 = (pTVar1->type_param_).ptr_;
              if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar4 = 0x12d432;
                printf("  # %s = ");
                pbVar3 = (pTVar1->type_param_).ptr_;
                if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  pcVar11 = (char *)0x0;
                }
                else {
                  pcVar11 = (pbVar3->_M_dataplus)._M_p;
                }
                PrintOnOneLine(pcVar11,iVar4);
              }
              putchar(10);
            }
            printf("  %s",(pTVar2->name_)._M_dataplus._M_p);
            pbVar3 = (pTVar2->value_param_).ptr_;
            if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar4 = 0x12d498;
              printf("  # %s = ");
              pbVar3 = (pTVar2->value_param_).ptr_;
              if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                pcVar11 = (char *)0x0;
              }
              else {
                pcVar11 = (pbVar3->_M_dataplus)._M_p;
              }
              PrintOnOneLine(pcVar11,iVar4);
            }
            putchar(10);
            ppTVar5 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppTVar6 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar7 = true;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)ppTVar6 - (long)ppTVar5 >> 3));
        ppTVar8 = (this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar10 = (this->test_cases_).
                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)ppTVar10 - (long)ppTVar8 >> 3));
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  iVar4 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)local_1d8);
    if (iVar4 != 0) goto LAB_00119ec7;
  }
  UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,(char *)local_220._0_8_,(allocator<char> *)local_1f8);
  __stream = (FILE *)OpenFileForWriting((string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  iVar4 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar4 == 0) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
              ((XmlUnitTestResultPrinter *)local_220,(char *)local_1f8[0]);
    XmlUnitTestResultPrinter::PrintXmlTestsList((ostream *)(local_1b8 + 0x10),&this->test_cases_);
    local_220._0_8_ = &PTR__XmlUnitTestResultPrinter_0013e4e0;
LAB_00119e34:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._8_8_ != &local_208) {
      operator_delete((void *)local_220._8_8_,local_208._M_allocated_capacity + 1);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_1d8);
    if (iVar4 == 0) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                ((JsonUnitTestResultPrinter *)local_220,(char *)local_1f8[0]);
      JsonUnitTestResultPrinter::PrintJsonTestList((ostream *)(local_1b8 + 0x10),&this->test_cases_)
      ;
      local_220._0_8_ = &PTR__JsonUnitTestResultPrinter_0013e568;
      goto LAB_00119e34;
    }
  }
  StringStreamToString((string *)local_220,(stringstream *)local_1b8);
  fputs((char *)local_220._0_8_,__stream);
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00119ec7:
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  return;
}

Assistant:

const char* String::Utf16ToAnsi(LPCWSTR utf16_str)  {
  if (!utf16_str) return NULL;
  const int ansi_length =
      WideCharToMultiByte(CP_ACP, 0, utf16_str, -1,
                          NULL, 0, NULL, NULL);
  char* ansi = new char[ansi_length + 1];
  WideCharToMultiByte(CP_ACP, 0, utf16_str, -1,
                      ansi, ansi_length, NULL, NULL);
  ansi[ansi_length] = 0;
  return ansi;
}